

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

RK_S32 mpp_av1_quantization_params(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  AV1RawSequenceHeader *pAVar1;
  bool bVar2;
  RK_S8 RVar3;
  AV1RawFrameHeader *pAVar4;
  RK_U8 RVar5;
  RK_S32 RVar6;
  RK_S32 RVar7;
  RK_S32 RVar8;
  RK_U32 value;
  RK_U8 local_3c [4];
  AV1RawFrameHeader *local_38;
  
  pAVar1 = ctx->sequence_header;
  RVar6 = mpp_av1_read_unsigned(gb,8,"base_q_idx",(RK_U32 *)local_3c,0,0xff);
  if (RVar6 < 0) {
    return RVar6;
  }
  current->base_q_idx = local_3c[0];
  bVar2 = false;
  local_38 = current;
  RVar7 = mpp_av1_read_unsigned(gb,1,"delta_q_y_dc.delta_coded",(RK_U32 *)local_3c,0,1);
  RVar8 = -1;
  if (-1 < RVar7) {
    if (local_3c[0] == '\0') {
      RVar5 = '\0';
    }
    else {
      RVar7 = mpp_av1_read_signed(gb,7,"delta_q_y_dc.delta_q",(RK_S32 *)local_3c,-0x40,0x3f);
      RVar8 = -1;
      RVar5 = local_3c[0];
      if (RVar7 < 0) {
        bVar2 = false;
        goto LAB_001c5e45;
      }
    }
    local_38->delta_q_y_dc = RVar5;
    bVar2 = true;
    RVar8 = RVar6;
  }
LAB_001c5e45:
  if (!bVar2) {
    return RVar8;
  }
  if (ctx->num_planes < 2) {
    local_38->delta_q_u_dc = '\0';
    local_38->delta_q_u_ac = '\0';
    local_38->delta_q_v_dc = '\0';
    local_38->delta_q_v_ac = '\0';
    goto LAB_001c5eb8;
  }
  if ((pAVar1->color_config).separate_uv_delta_q == '\0') {
    local_38->diff_uv_delta = '\0';
  }
  else {
    RVar6 = mpp_av1_read_unsigned(gb,1,"diff_uv_delta",(RK_U32 *)local_3c,0,1);
    if (RVar6 < 0) {
      return -1;
    }
    local_38->diff_uv_delta = local_3c[0];
  }
  bVar2 = false;
  RVar7 = mpp_av1_read_unsigned(gb,1,"delta_q_u_dc.delta_coded",(RK_U32 *)local_3c,0,1);
  pAVar4 = local_38;
  RVar6 = -1;
  if (-1 < RVar7) {
    if (local_3c[0] == '\0') {
      RVar5 = '\0';
    }
    else {
      RVar6 = mpp_av1_read_signed(gb,7,"delta_q_u_dc.delta_q",(RK_S32 *)local_3c,-0x40,0x3f);
      RVar5 = local_3c[0];
      if (RVar6 < 0) {
        RVar6 = -1;
        bVar2 = false;
        goto LAB_001c603f;
      }
    }
    pAVar4->delta_q_u_dc = RVar5;
    bVar2 = true;
    RVar6 = RVar8;
  }
LAB_001c603f:
  if (!bVar2) {
    return RVar6;
  }
  bVar2 = false;
  RVar7 = mpp_av1_read_unsigned(gb,1,"delta_q_u_ac.delta_coded",(RK_U32 *)local_3c,0,1);
  RVar8 = -1;
  if (-1 < RVar7) {
    if (local_3c[0] == '\0') {
      RVar5 = '\0';
    }
    else {
      RVar8 = mpp_av1_read_signed(gb,7,"delta_q_u_ac.delta_q",(RK_S32 *)local_3c,-0x40,0x3f);
      RVar5 = local_3c[0];
      if (RVar8 < 0) {
        RVar8 = -1;
        bVar2 = false;
        goto LAB_001c6146;
      }
    }
    local_38->delta_q_u_ac = RVar5;
    bVar2 = true;
    RVar8 = RVar6;
  }
LAB_001c6146:
  if (!bVar2) {
    return RVar8;
  }
  if (local_38->diff_uv_delta == '\0') {
    RVar3 = local_38->delta_q_u_ac;
    local_38->delta_q_v_dc = local_38->delta_q_u_dc;
    local_38->delta_q_v_ac = RVar3;
    goto LAB_001c5eb8;
  }
  bVar2 = false;
  RVar7 = mpp_av1_read_unsigned(gb,1,"delta_q_v_dc.delta_coded",(RK_U32 *)local_3c,0,1);
  pAVar4 = local_38;
  RVar6 = -1;
  if (-1 < RVar7) {
    if (local_3c[0] == '\0') {
      RVar5 = '\0';
    }
    else {
      RVar6 = mpp_av1_read_signed(gb,7,"delta_q_v_dc.delta_q",(RK_S32 *)local_3c,-0x40,0x3f);
      RVar5 = local_3c[0];
      if (RVar6 < 0) {
        RVar6 = -1;
        bVar2 = false;
        goto LAB_001c620d;
      }
    }
    pAVar4->delta_q_v_dc = RVar5;
    bVar2 = true;
    RVar6 = RVar8;
  }
LAB_001c620d:
  if (!bVar2) {
    return RVar6;
  }
  bVar2 = false;
  RVar7 = mpp_av1_read_unsigned(gb,1,"delta_q_v_ac.delta_coded",(RK_U32 *)local_3c,0,1);
  RVar8 = -1;
  if (-1 < RVar7) {
    if (local_3c[0] == '\0') {
      RVar5 = '\0';
    }
    else {
      RVar8 = mpp_av1_read_signed(gb,7,"delta_q_v_ac.delta_q",(RK_S32 *)local_3c,-0x40,0x3f);
      RVar5 = local_3c[0];
      if (RVar8 < 0) {
        RVar8 = -1;
        bVar2 = false;
        goto LAB_001c62ad;
      }
    }
    local_38->delta_q_v_ac = RVar5;
    bVar2 = true;
    RVar8 = RVar6;
  }
LAB_001c62ad:
  if (!bVar2) {
    return RVar8;
  }
LAB_001c5eb8:
  RVar6 = mpp_av1_read_unsigned(gb,1,"using_qmatrix",(RK_U32 *)local_3c,0,1);
  if (RVar6 < 0) {
    return -1;
  }
  local_38->using_qmatrix = local_3c[0];
  if (local_38->using_qmatrix != '\0') {
    RVar6 = mpp_av1_read_unsigned(gb,4,"qm_y",(RK_U32 *)local_3c,0,0xf);
    if (RVar6 < 0) {
      return -1;
    }
    local_38->qm_y = local_3c[0];
    RVar6 = mpp_av1_read_unsigned(gb,4,"qm_u",(RK_U32 *)local_3c,0,0xf);
    if (RVar6 < 0) {
      return -1;
    }
    local_38->qm_u = local_3c[0];
    if ((pAVar1->color_config).separate_uv_delta_q == '\0') {
      local_38->qm_v = local_38->qm_u;
    }
    else {
      RVar6 = mpp_av1_read_unsigned(gb,4,"qm_v",(RK_U32 *)local_3c,0,0xf);
      if (RVar6 < 0) {
        return -1;
      }
      local_38->qm_v = local_3c[0];
    }
  }
  return 0;
}

Assistant:

static RK_S32 mpp_av1_quantization_params(AV1Context *ctx, BitReadCtx_t *gb,
                                          AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 err;

    fb(8, base_q_idx);

    delta_q(delta_q_y_dc);

    if (ctx->num_planes > 1) {
        if (seq->color_config.separate_uv_delta_q)
            flag(diff_uv_delta);
        else
            infer(diff_uv_delta, 0);

        delta_q(delta_q_u_dc);
        delta_q(delta_q_u_ac);

        if (current->diff_uv_delta) {
            delta_q(delta_q_v_dc);
            delta_q(delta_q_v_ac);
        } else {
            infer(delta_q_v_dc, current->delta_q_u_dc);
            infer(delta_q_v_ac, current->delta_q_u_ac);
        }
    } else {
        infer(delta_q_u_dc, 0);
        infer(delta_q_u_ac, 0);
        infer(delta_q_v_dc, 0);
        infer(delta_q_v_ac, 0);
    }

    flag(using_qmatrix);
    if (current->using_qmatrix) {
        fb(4, qm_y);
        fb(4, qm_u);
        if (seq->color_config.separate_uv_delta_q)
            fb(4, qm_v);
        else
            infer(qm_v, current->qm_u);
    }

    return 0;
}